

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::InstanceBodySymbol::InstanceBodySymbol
          (InstanceBodySymbol *this,Compilation *compilation,DefinitionSymbol *definition,
          HierarchyOverrideNode *hierarchyOverrideNode,bitmask<slang::ast::InstanceFlags> flags)

{
  SymbolIndex SVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar3 = (definition->super_Symbol).name._M_len;
  pcVar4 = (definition->super_Symbol).name._M_str;
  SVar2 = (definition->super_Symbol).location;
  (this->super_Symbol).kind = InstanceBody;
  (this->super_Symbol).name._M_len = sVar3;
  (this->super_Symbol).name._M_str = pcVar4;
  (this->super_Symbol).location = SVar2;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->parentInstance = (InstanceSymbol *)0x0;
  this->hierarchyOverrideNode = hierarchyOverrideNode;
  (this->flags).m_bits = flags.m_bits;
  this->definition = definition;
  (this->portList)._M_ptr = (pointer)0x0;
  (this->portList)._M_extent._M_extent_value = 0;
  (this->parameters)._M_ptr = (pointer)0x0;
  (this->parameters)._M_extent._M_extent_value = 0;
  SVar1 = (definition->super_Symbol).indexInScope;
  (this->super_Symbol).parentScope = (definition->super_Symbol).parentScope;
  (this->super_Symbol).indexInScope = SVar1;
  return;
}

Assistant:

InstanceBodySymbol::InstanceBodySymbol(Compilation& compilation, const DefinitionSymbol& definition,
                                       const HierarchyOverrideNode* hierarchyOverrideNode,
                                       bitmask<InstanceFlags> flags) :
    Symbol(SymbolKind::InstanceBody, definition.name, definition.location),
    Scope(compilation, this), hierarchyOverrideNode(hierarchyOverrideNode), flags(flags),
    definition(definition) {

    setParent(*definition.getParentScope(), definition.getIndex());
}